

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParseCtxtExternalEntity(xmlParserCtxtPtr ctx,xmlChar *URL,xmlChar *ID,xmlNodePtr *lst)

{
  void *local_38;
  void *userData;
  xmlNodePtr *lst_local;
  xmlChar *ID_local;
  xmlChar *URL_local;
  xmlParserCtxtPtr ctx_local;
  
  if (ctx == (xmlParserCtxtPtr)0x0) {
    ctx_local._4_4_ = ~XML_ERR_OK;
  }
  else {
    if ((xmlParserCtxtPtr)ctx->userData == ctx) {
      local_38 = (void *)0x0;
    }
    else {
      local_38 = ctx->userData;
    }
    ctx_local._4_4_ =
         xmlParseExternalEntityPrivate(ctx->myDoc,ctx,ctx->sax,local_38,ctx->depth + 1,URL,ID,lst);
  }
  return ctx_local._4_4_;
}

Assistant:

int
xmlParseCtxtExternalEntity(xmlParserCtxtPtr ctx, const xmlChar *URL,
	               const xmlChar *ID, xmlNodePtr *lst) {
    void *userData;

    if (ctx == NULL) return(-1);
    /*
     * If the user provided their own SAX callbacks, then reuse the
     * userData callback field, otherwise the expected setup in a
     * DOM builder is to have userData == ctxt
     */
    if (ctx->userData == ctx)
        userData = NULL;
    else
        userData = ctx->userData;
    return xmlParseExternalEntityPrivate(ctx->myDoc, ctx, ctx->sax,
                                         userData, ctx->depth + 1,
                                         URL, ID, lst);
}